

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void libtorrent::find_ip_address(int type,string_view string,ip_address_parse_state *state)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view string_00;
  bool bVar1;
  string *this;
  const_iterator __first;
  const_iterator __last;
  error_code_parse_state *in_R8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  size_t local_48;
  char *local_40;
  size_t local_38;
  char *local_30;
  ip_address_parse_state *local_28;
  ip_address_parse_state *state_local;
  undefined1 auStack_18 [4];
  int type_local;
  string_view string_local;
  
  local_30 = string._M_str;
  local_38 = string._M_len;
  string_00._M_str = (char *)state;
  string_00._M_len = (size_t)local_30;
  local_28 = state;
  state_local._4_4_ = type;
  _auStack_18 = local_38;
  string_local._M_len = (size_t)local_30;
  find_error_code((libtorrent *)(ulong)(uint)type,(int)string._M_len,string_00,in_R8);
  if (((local_28->super_error_code_parse_state).exit & 1U) == 0) {
    if (state_local._4_4_ == 0) {
      local_48 = _auStack_18;
      local_40 = (char *)string_local._M_len;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"NewExternalIPAddress");
      __x._M_str = local_40;
      __x._M_len = local_48;
      bVar1 = ::std::operator==(__x,local_58);
      if (bVar1) {
        local_28->in_ip_address = true;
        return;
      }
    }
    if ((state_local._4_4_ == 4) && ((local_28->in_ip_address & 1U) != 0)) {
      this = &local_28->ip_address;
      __first = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
      __last = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
      ::std::__cxx11::string::assign<char_const*,void>((string *)this,__first,__last);
      (local_28->super_error_code_parse_state).exit = true;
    }
  }
  return;
}

Assistant:

void find_ip_address(int const type, string_view string, ip_address_parse_state& state)
{
	find_error_code(type, string, state);
	if (state.exit) return;

	if (type == xml_start_tag && string == "NewExternalIPAddress")
	{
		state.in_ip_address = true;
	}
	else if (type == xml_string && state.in_ip_address)
	{
		state.ip_address.assign(string.begin(), string.end());
		state.exit = true;
	}
}